

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.h
# Opt level: O2

string * __thiscall
CoreML::Specification::Imputer::mutable_imputedstringvalue_abi_cxx11_(Imputer *this)

{
  string *psVar1;
  
  if (this->_oneof_case_[0] != 3) {
    clear_ImputedValue(this);
    this->_oneof_case_[0] = 3;
    (this->ImputedValue_).imputeddoublevalue_ =
         (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  }
  psVar1 = google::protobuf::internal::ArenaStringPtr::MutableNoArena
                     (&(this->ImputedValue_).imputedstringvalue_,
                      (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  return psVar1;
}

Assistant:

inline ::std::string* Imputer::mutable_imputedstringvalue() {
  if (!has_imputedstringvalue()) {
    clear_ImputedValue();
    set_has_imputedstringvalue();
    ImputedValue_.imputedstringvalue_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Imputer.imputedStringValue)
  return ImputedValue_.imputedstringvalue_.MutableNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
}